

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

object * store_find_kind(store *s,object_kind *k,_func__Bool_store_ptr_object_ptr *fexclude)

{
  _Bool _Var1;
  object *local_30;
  object *obj;
  _func__Bool_store_ptr_object_ptr *fexclude_local;
  object_kind *k_local;
  store *s_local;
  
  if (s == (store *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x4d2,
                  "struct object *store_find_kind(struct store *, struct object_kind *, _Bool (*)(struct store *, struct object *))"
                 );
  }
  if (k != (object_kind *)0x0) {
    local_30 = s->stock;
    while( true ) {
      if (local_30 == (object *)0x0) {
        return (object *)0x0;
      }
      if ((local_30->kind == k) &&
         ((fexclude == (_func__Bool_store_ptr_object_ptr *)0x0 ||
          (_Var1 = (*fexclude)(s,local_30), !_Var1)))) break;
      local_30 = local_30->next;
    }
    return local_30;
  }
  __assert_fail("k",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                ,0x4d3,
                "struct object *store_find_kind(struct store *, struct object_kind *, _Bool (*)(struct store *, struct object *))"
               );
}

Assistant:

static struct object *store_find_kind(struct store *s, struct object_kind *k,
		bool (*fexclude)(struct store *, struct object *)) {
	struct object *obj;

	assert(s);
	assert(k);

	/* Check if it's already in stock */
	for (obj = s->stock; obj; obj = obj->next) {
		if (obj->kind == k && (fexclude == NULL ||
			!((*fexclude)(s, obj)))) return obj;
	}

	return NULL;
}